

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_GammaCorrection
          (GammaCorrectionForm2 GammaCorrection,string *namespaceName,uint32_t size)

{
  uint uVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference pvVar4;
  uint32_t in_EDX;
  code *in_RDI;
  BaseTimerContainer *this;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  pair<double,_double> pVar7;
  uint32_t i;
  TimerContainer timer;
  double gamma;
  double a;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer *in_stack_ffffffffffffff40;
  TimerContainer *in_stack_ffffffffffffff50;
  uint local_84;
  uint32_t in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffd8;
  
  auVar5 = in_ZMM0._0_16_;
  Test_Helper::uniformImages(in_EDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  uVar1 = Test_Helper::randomValue<unsigned_int>(0x1737c3);
  auVar5 = vcvtusi2sd_avx512f(auVar5,uVar1);
  auVar6._0_8_ = auVar5._0_8_ / 100.0;
  auVar6._8_8_ = auVar5._8_8_;
  auVar5 = auVar6;
  uVar1 = Test_Helper::randomValue<unsigned_int>(0x1737f2);
  auVar5 = vcvtusi2sd_avx512f(auVar5,uVar1);
  this = (BaseTimerContainer *)(auVar5._0_8_ / 100.0);
  SetupFunction((string *)0x173821);
  Performance_Test::TimerContainer::TimerContainer(in_stack_ffffffffffffff40);
  local_84 = 0;
  while( true ) {
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= local_84) break;
    Performance_Test::TimerContainer::start(in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff50 = (TimerContainer *)&stack0xffffffffffffffc0;
    pvVar3 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff50,0);
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff50,1);
    (*in_RDI)(auVar6._0_8_,this,pvVar3,pvVar4);
    Performance_Test::TimerContainer::stop(in_stack_ffffffffffffff50);
    local_84 = local_84 + 1;
  }
  CleanupFunction((string *)0x173915);
  pVar7 = Performance_Test::BaseTimerContainer::mean(this);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x173957);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffff50);
  return pVar7;
}

Assistant:

std::pair < double, double > template_GammaCorrection( GammaCorrectionForm2 GammaCorrection, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );
        double a     = Performance_Test::randomValue <uint32_t>( 100 ) / 100.0;
        double gamma = Performance_Test::randomValue <uint32_t>( 300 ) / 100.0;

        TEST_FUNCTION_LOOP( GammaCorrection( image[0], image[1], a, gamma ), namespaceName )
    }